

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O2

bool embree::sse42::InstanceIntersector1::pointQuery
               (PointQuery *query,PointQueryContext *context,InstancePrimitive *prim)

{
  float (*pafVar1) [16];
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  Instance *pIVar7;
  AffineSpace3ff *pAVar8;
  RTCPointQueryContext *pRVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool bVar17;
  undefined1 uVar18;
  uint uVar19;
  undefined4 uVar20;
  float __x;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar27;
  float fVar28;
  undefined1 auVar25 [16];
  float fVar29;
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar49 [16];
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined8 local_128;
  undefined8 local_120;
  float local_118;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  long local_88;
  undefined8 local_80;
  PointQuery *local_78;
  undefined4 local_70;
  PointQueryFunction local_68;
  RTCPointQueryContext *pRStack_60;
  float local_58;
  void *local_50;
  undefined8 local_48;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  pIVar7 = prim->instance;
  pAVar8 = pIVar7->local2world;
  if ((pIVar7->super_Geometry).field_8.field_0x1 == '\x01') {
    fVar53 = (pAVar8->p).field_0.m128[3];
    fVar54 = (pAVar8->l).vx.field_0.m128[3];
    fVar55 = (pAVar8->l).vy.field_0.m128[3];
    fVar56 = (pAVar8->l).vz.field_0.m128[3];
    aVar5 = (pAVar8->l).vx.field_0.field_1;
    fVar58 = aVar5.x;
    fVar29 = fVar54 * fVar55 + fVar53 * fVar56;
    fVar41 = fVar54 * fVar55 - fVar53 * fVar56;
    fVar43 = fVar53 * fVar53 + fVar54 * fVar54 + -fVar55 * fVar55 + -fVar56 * fVar56;
    fVar28 = fVar53 * fVar53 - fVar54 * fVar54;
    fVar36 = fVar55 * fVar55 + fVar28 + -fVar56 * fVar56;
    fVar32 = fVar54 * fVar56 - fVar53 * fVar55;
    fVar45 = fVar53 * fVar55 + fVar54 * fVar56;
    fVar42 = fVar55 * fVar56 + fVar53 * fVar54;
    fVar53 = fVar55 * fVar56 - fVar53 * fVar54;
    aVar6 = (pAVar8->l).vy.field_0.field_1;
    fVar24 = aVar6.x;
    fVar27 = aVar6.y;
    fVar29 = fVar29 + fVar29;
    fVar32 = fVar32 + fVar32;
    fVar54 = fVar56 * fVar56 + fVar28 + -fVar55 * fVar55;
    fVar37 = fVar43 * 1.0 + fVar29 * 0.0 + fVar32 * 0.0;
    fVar38 = fVar43 * 0.0 + fVar29 * 1.0 + fVar32 * 0.0;
    fVar39 = fVar43 * 0.0 + fVar29 * 0.0 + fVar32 * 1.0;
    fVar40 = fVar43 * 0.0 + fVar29 * 0.0 + fVar32 * 0.0;
    fVar32 = (pAVar8->l).vz.field_0.m128[0];
    fVar33 = (pAVar8->l).vz.field_0.m128[1];
    fVar34 = (pAVar8->l).vz.field_0.m128[2];
    fVar42 = fVar42 + fVar42;
    fVar47 = (pAVar8->p).field_0.m128[0];
    fVar48 = (pAVar8->p).field_0.m128[1];
    fVar50 = (pAVar8->p).field_0.m128[2];
    fVar41 = fVar41 + fVar41;
    fVar35 = fVar41 * 1.0 + fVar36 * 0.0 + fVar42 * 0.0;
    fVar51 = fVar41 * 0.0 + fVar36 * 1.0 + fVar42 * 0.0;
    fVar52 = fVar41 * 0.0 + fVar36 * 0.0 + fVar42 * 1.0;
    fVar36 = fVar41 * 0.0 + fVar36 * 0.0 + fVar42 * 0.0;
    auVar30._0_8_ = aVar5._4_8_;
    auVar30._8_8_ = 0;
    auVar30 = blendps(auVar30,(undefined1  [16])aVar6,4);
    fVar45 = fVar45 + fVar45;
    fVar53 = fVar53 + fVar53;
    fVar42 = fVar45 * 1.0 + fVar53 * 0.0 + fVar54 * 0.0;
    fVar44 = fVar45 * 0.0 + fVar53 * 1.0 + fVar54 * 0.0;
    fVar46 = fVar45 * 0.0 + fVar53 * 0.0 + fVar54 * 1.0;
    fVar57 = fVar45 * 0.0 + fVar53 * 0.0 + fVar54 * 0.0;
    fVar53 = fVar58 * fVar37 + fVar35 * 0.0 + fVar42 * 0.0;
    fVar54 = fVar58 * fVar38 + fVar51 * 0.0 + fVar44 * 0.0;
    fVar55 = fVar58 * fVar39 + fVar52 * 0.0 + fVar46 * 0.0;
    fVar56 = fVar58 * fVar40 + fVar36 * 0.0 + fVar57 * 0.0;
    fVar41 = fVar24 * fVar37 + fVar27 * fVar35 + fVar42 * 0.0;
    fVar43 = fVar24 * fVar38 + fVar27 * fVar51 + fVar44 * 0.0;
    fVar45 = fVar24 * fVar39 + fVar27 * fVar52 + fVar46 * 0.0;
    fVar24 = fVar24 * fVar40 + fVar27 * fVar36 + fVar57 * 0.0;
    fVar27 = fVar32 * fVar37 + fVar33 * fVar35 + fVar34 * fVar42;
    fVar28 = fVar32 * fVar38 + fVar33 * fVar51 + fVar34 * fVar44;
    fVar29 = fVar32 * fVar39 + fVar33 * fVar52 + fVar34 * fVar46;
    fVar32 = fVar32 * fVar40 + fVar33 * fVar36 + fVar34 * fVar57;
    fVar33 = fVar47 * fVar37 + fVar48 * fVar35 + fVar50 * fVar42 + auVar30._0_4_ + 0.0;
    fVar34 = fVar47 * fVar38 + fVar48 * fVar51 + fVar50 * fVar44 + auVar30._4_4_ + 0.0;
    fVar35 = fVar47 * fVar39 + fVar48 * fVar52 + fVar50 * fVar46 + auVar30._8_4_ + 0.0;
    fVar47 = fVar47 * fVar40 + fVar48 * fVar36 + fVar50 * fVar57 + auVar30._12_4_ + 0.0;
  }
  else {
    fVar53 = (pAVar8->l).vx.field_0.m128[0];
    fVar54 = (pAVar8->l).vx.field_0.m128[1];
    fVar55 = (pAVar8->l).vx.field_0.m128[2];
    fVar56 = (pAVar8->l).vx.field_0.m128[3];
    fVar41 = (pAVar8->l).vy.field_0.m128[0];
    fVar43 = (pAVar8->l).vy.field_0.m128[1];
    fVar45 = (pAVar8->l).vy.field_0.m128[2];
    fVar24 = (pAVar8->l).vy.field_0.m128[3];
    fVar27 = (pAVar8->l).vz.field_0.m128[0];
    fVar28 = (pAVar8->l).vz.field_0.m128[1];
    fVar29 = (pAVar8->l).vz.field_0.m128[2];
    fVar32 = (pAVar8->l).vz.field_0.m128[3];
    fVar33 = (pAVar8->p).field_0.m128[0];
    fVar34 = (pAVar8->p).field_0.m128[1];
    fVar35 = (pAVar8->p).field_0.m128[2];
    fVar47 = (pAVar8->p).field_0.m128[3];
  }
  auVar30 = *(undefined1 (*) [16])(pIVar7->world2local0).l.vx.field_0.m128;
  fVar36 = auVar30._0_4_;
  fVar37 = auVar30._4_4_;
  fVar38 = auVar30._8_4_;
  fVar39 = auVar30._12_4_;
  auVar22 = *(undefined1 (*) [16])(pIVar7->world2local0).l.vy.field_0.m128;
  fVar40 = auVar22._0_4_;
  fVar42 = auVar22._4_4_;
  fVar44 = auVar22._8_4_;
  fVar46 = auVar22._12_4_;
  auVar31 = *(undefined1 (*) [16])(pIVar7->world2local0).l.vz.field_0.m128;
  fVar57 = auVar31._0_4_;
  fVar58 = auVar31._4_4_;
  fVar59 = auVar31._8_4_;
  fVar60 = auVar31._12_4_;
  fVar48 = (pIVar7->world2local0).p.field_0.m128[0];
  fVar50 = (pIVar7->world2local0).p.field_0.m128[1];
  fVar51 = (pIVar7->world2local0).p.field_0.m128[2];
  fVar52 = (pIVar7->world2local0).p.field_0.m128[3];
  uVar20 = 2;
  bVar17 = true;
  local_58 = 0.0;
  if ((((context->query_type == POINT_QUERY_TYPE_SPHERE) &&
       (auVar21 = dpps(auVar30,auVar22,0x7f), ABS(auVar21._0_4_) <= 1e-05)) &&
      (auVar21 = dpps(auVar30,auVar31,0x7f), ABS(auVar21._0_4_) <= 1e-05)) &&
     (auVar21 = dpps(auVar22,auVar31,0x7f), ABS(auVar21._0_4_) <= 1e-05)) {
    auVar21 = dpps(auVar30,auVar30,0x7f);
    auVar25 = dpps(auVar22,auVar22,0x7f);
    __x = auVar21._0_4_;
    if (ABS(__x - auVar25._0_4_) <= 1e-05) {
      auVar21 = dpps(auVar31,auVar31,0x7f);
      if ((ABS(__x - auVar21._0_4_) <= 1e-05) && (ABS(auVar25._0_4_ - auVar21._0_4_) <= 1e-05)) {
        uVar20 = 1;
        if (__x < 0.0) {
          _local_108 = auVar31;
          local_f8 = fVar48;
          fStack_f4 = fVar50;
          fStack_f0 = fVar51;
          fStack_ec = fVar52;
          _local_e8 = auVar22;
          _local_d8 = auVar30;
          local_c8 = fVar41;
          fStack_c4 = fVar43;
          fStack_c0 = fVar45;
          fStack_bc = fVar24;
          local_b8 = fVar33;
          fStack_b4 = fVar34;
          fStack_b0 = fVar35;
          fStack_ac = fVar47;
          local_a8 = fVar27;
          fStack_a4 = fVar28;
          fStack_a0 = fVar29;
          fStack_9c = fVar32;
          local_98 = fVar53;
          fStack_94 = fVar54;
          fStack_90 = fVar55;
          fStack_8c = fVar56;
          local_58 = sqrtf(__x);
          fVar36 = (float)local_d8._0_4_;
          fVar37 = (float)local_d8._4_4_;
          fVar38 = fStack_d0;
          fVar39 = fStack_cc;
          fVar40 = (float)local_e8._0_4_;
          fVar42 = (float)local_e8._4_4_;
          fVar44 = fStack_e0;
          fVar46 = fStack_dc;
          fVar41 = local_c8;
          fVar43 = fStack_c4;
          fVar45 = fStack_c0;
          fVar24 = fStack_bc;
          fVar27 = local_a8;
          fVar28 = fStack_a4;
          fVar29 = fStack_a0;
          fVar32 = fStack_9c;
          fVar33 = local_b8;
          fVar34 = fStack_b4;
          fVar35 = fStack_b0;
          fVar47 = fStack_ac;
          fVar57 = (float)local_108._0_4_;
          fVar58 = (float)local_108._4_4_;
          fVar59 = fStack_100;
          fVar60 = fStack_fc;
          fVar53 = local_98;
          fVar54 = fStack_94;
          fVar55 = fStack_90;
          fVar56 = fStack_8c;
          fVar48 = local_f8;
          fVar50 = fStack_f4;
          fVar51 = fStack_f0;
          fVar52 = fStack_ec;
        }
        else {
          local_58 = SQRT(__x);
        }
        bVar17 = false;
      }
    }
  }
  pRVar9 = context->userContext;
  uVar19 = pRVar9->instStackSize;
  pRVar9->instID[uVar19] = prim->instID_;
  pRVar9->instPrimID[uVar19] = 0;
  pafVar1 = pRVar9->world2inst + uVar19;
  (*pafVar1)[0] = fVar36;
  (*pafVar1)[1] = fVar37;
  (*pafVar1)[2] = fVar38;
  (*pafVar1)[3] = fVar39;
  pfVar2 = pRVar9->world2inst[uVar19] + 4;
  *pfVar2 = fVar40;
  pfVar2[1] = fVar42;
  pfVar2[2] = fVar44;
  pfVar2[3] = fVar46;
  pfVar2 = pRVar9->world2inst[uVar19] + 8;
  *pfVar2 = fVar57;
  pfVar2[1] = fVar58;
  pfVar2[2] = fVar59;
  pfVar2[3] = fVar60;
  pfVar2 = pRVar9->world2inst[uVar19] + 0xc;
  *pfVar2 = fVar48;
  pfVar2[1] = fVar50;
  pfVar2[2] = fVar51;
  pfVar2[3] = fVar52;
  pafVar1 = pRVar9->inst2world + uVar19;
  (*pafVar1)[0] = fVar53;
  (*pafVar1)[1] = fVar54;
  (*pafVar1)[2] = fVar55;
  (*pafVar1)[3] = fVar56;
  pfVar2 = pRVar9->inst2world[uVar19] + 4;
  *pfVar2 = fVar41;
  pfVar2[1] = fVar43;
  pfVar2[2] = fVar45;
  pfVar2[3] = fVar24;
  pfVar2 = pRVar9->inst2world[uVar19] + 8;
  *pfVar2 = fVar27;
  pfVar2[1] = fVar28;
  pfVar2[2] = fVar29;
  pfVar2[3] = fVar32;
  pfVar2 = pRVar9->inst2world[uVar19] + 0xc;
  *pfVar2 = fVar33;
  pfVar2[1] = fVar34;
  pfVar2[2] = fVar35;
  pfVar2[3] = fVar47;
  pRVar9->instStackSize = pRVar9->instStackSize + 1;
  fVar53 = (query->p).field_0.field_0.x;
  fVar54 = (query->p).field_0.field_0.y;
  fVar55 = (query->p).field_0.field_0.z;
  auVar22._0_8_ =
       CONCAT44(fVar53 * fVar37 + fVar54 * fVar42 + fVar55 * fVar58 + fVar50,
                fVar53 * fVar36 + fVar54 * fVar40 + fVar55 * fVar57 + fVar48);
  auVar22._8_4_ = fVar53 * fVar38 + fVar54 * fVar44 + fVar55 * fVar59 + fVar51;
  auVar22._12_4_ = fVar53 * fVar39 + fVar54 * fVar46 + fVar55 * fVar60 + fVar52;
  local_120 = extractps(auVar22,2);
  local_118 = query->radius * local_58;
  local_88 = *(long *)&(pIVar7->super_Geometry).field_0x58;
  local_78 = context->query_ws;
  local_50 = context->userPtr;
  local_80 = 0;
  local_68 = context->func;
  pRStack_60 = context->userContext;
  local_48 = 0xffffffffffffffff;
  local_38 = local_78->radius;
  if (bVar17) {
    fStack_34 = local_38;
    fStack_30 = local_38;
    fStack_2c = local_38;
    if ((local_38 < INFINITY) && (pRStack_60->instStackSize != 0)) {
      uVar19 = pRStack_60->instStackSize - 1;
      pafVar1 = pRStack_60->world2inst + uVar19;
      pfVar2 = pRStack_60->world2inst[uVar19] + 4;
      pfVar3 = pRStack_60->world2inst[uVar19] + 8;
      pfVar4 = pRStack_60->world2inst[uVar19] + 0xc;
      fVar24 = *pfVar4 - *pfVar3 * local_38;
      fVar27 = pfVar4[1] - pfVar3[1] * local_38;
      fVar28 = pfVar4[2] - pfVar3[2] * local_38;
      fVar29 = pfVar4[3] - pfVar3[3] * local_38;
      fVar32 = -local_38 * *pfVar2;
      fVar33 = -local_38 * pfVar2[1];
      fVar34 = -local_38 * pfVar2[2];
      fVar35 = -local_38 * pfVar2[3];
      fVar48 = fVar32 + fVar24;
      fVar50 = fVar33 + fVar27;
      fVar51 = fVar34 + fVar28;
      fVar52 = fVar35 + fVar29;
      fVar41 = -local_38 * (*pafVar1)[0];
      fVar43 = -local_38 * (*pafVar1)[1];
      fVar45 = -local_38 * (*pafVar1)[2];
      fVar47 = -local_38 * (*pafVar1)[3];
      fVar53 = fVar41 + fVar48;
      fVar54 = fVar43 + fVar50;
      fVar55 = fVar45 + fVar51;
      fVar56 = fVar47 + fVar52;
      auVar15._4_4_ = fVar54;
      auVar15._0_4_ = fVar53;
      auVar15._8_4_ = fVar55;
      auVar15._12_4_ = fVar56;
      auVar30 = minps(_DAT_01f45a30,auVar15);
      auVar16._4_4_ = fVar54;
      auVar16._0_4_ = fVar53;
      auVar16._8_4_ = fVar55;
      auVar16._12_4_ = fVar56;
      auVar31 = maxps(_DAT_01f45a40,auVar16);
      fVar36 = *pfVar3 * local_38 + *pfVar4;
      fVar37 = pfVar3[1] * local_38 + pfVar4[1];
      fVar38 = pfVar3[2] * local_38 + pfVar4[2];
      fVar39 = pfVar3[3] * local_38 + pfVar4[3];
      fVar32 = fVar32 + fVar36;
      fVar33 = fVar33 + fVar37;
      fVar34 = fVar34 + fVar38;
      fVar35 = fVar35 + fVar39;
      fVar53 = fVar41 + fVar32;
      fVar54 = fVar43 + fVar33;
      fVar55 = fVar45 + fVar34;
      fVar56 = fVar47 + fVar35;
      auVar11._4_4_ = fVar54;
      auVar11._0_4_ = fVar53;
      auVar11._8_4_ = fVar55;
      auVar11._12_4_ = fVar56;
      auVar30 = minps(auVar30,auVar11);
      auVar12._4_4_ = fVar54;
      auVar12._0_4_ = fVar53;
      auVar12._8_4_ = fVar55;
      auVar12._12_4_ = fVar56;
      auVar31 = maxps(auVar31,auVar12);
      fVar53 = *pfVar2 * local_38;
      fVar54 = pfVar2[1] * local_38;
      fVar55 = pfVar2[2] * local_38;
      fVar56 = pfVar2[3] * local_38;
      fVar24 = fVar24 + fVar53;
      fVar27 = fVar27 + fVar54;
      fVar28 = fVar28 + fVar55;
      fVar29 = fVar29 + fVar56;
      fVar40 = fVar41 + fVar24;
      fVar42 = fVar43 + fVar27;
      fVar44 = fVar45 + fVar28;
      fVar46 = fVar47 + fVar29;
      auVar13._4_4_ = fVar42;
      auVar13._0_4_ = fVar40;
      auVar13._8_4_ = fVar44;
      auVar13._12_4_ = fVar46;
      auVar30 = minps(auVar30,auVar13);
      auVar14._4_4_ = fVar42;
      auVar14._0_4_ = fVar40;
      auVar14._8_4_ = fVar44;
      auVar14._12_4_ = fVar46;
      auVar31 = maxps(auVar31,auVar14);
      fVar53 = fVar53 + fVar36;
      fVar54 = fVar54 + fVar37;
      fVar55 = fVar55 + fVar38;
      fVar56 = fVar56 + fVar39;
      fVar41 = fVar41 + fVar53;
      fVar43 = fVar43 + fVar54;
      fVar45 = fVar45 + fVar55;
      fVar47 = fVar47 + fVar56;
      auVar25._4_4_ = fVar43;
      auVar25._0_4_ = fVar41;
      auVar25._8_4_ = fVar45;
      auVar25._12_4_ = fVar47;
      auVar30 = minps(auVar30,auVar25);
      auVar10._4_4_ = fVar43;
      auVar10._0_4_ = fVar41;
      auVar10._8_4_ = fVar45;
      auVar10._12_4_ = fVar47;
      auVar31 = maxps(auVar31,auVar10);
      fVar41 = local_38 * (*pafVar1)[0];
      fVar43 = local_38 * (*pafVar1)[1];
      fVar45 = local_38 * (*pafVar1)[2];
      local_38 = local_38 * (*pafVar1)[3];
      auVar49._0_4_ = fVar48 + fVar41;
      auVar49._4_4_ = fVar50 + fVar43;
      auVar49._8_4_ = fVar51 + fVar45;
      auVar49._12_4_ = fVar52 + local_38;
      auVar30 = minps(auVar30,auVar49);
      auVar25 = maxps(auVar31,auVar49);
      fVar32 = fVar32 + fVar41;
      fVar33 = fVar33 + fVar43;
      fVar34 = fVar34 + fVar45;
      fVar35 = fVar35 + local_38;
      auVar31._4_4_ = fVar33;
      auVar31._0_4_ = fVar32;
      auVar31._8_4_ = fVar34;
      auVar31._12_4_ = fVar35;
      auVar30 = minps(auVar30,auVar31);
      auVar21._4_4_ = fVar33;
      auVar21._0_4_ = fVar32;
      auVar21._8_4_ = fVar34;
      auVar21._12_4_ = fVar35;
      auVar31 = maxps(auVar25,auVar21);
      auVar26._0_4_ = fVar24 + fVar41;
      auVar26._4_4_ = fVar27 + fVar43;
      auVar26._8_4_ = fVar28 + fVar45;
      auVar26._12_4_ = fVar29 + local_38;
      auVar30 = minps(auVar30,auVar26);
      auVar31 = maxps(auVar31,auVar26);
      auVar23._0_4_ = fVar41 + fVar53;
      auVar23._4_4_ = fVar43 + fVar54;
      auVar23._8_4_ = fVar45 + fVar55;
      auVar23._12_4_ = local_38 + fVar56;
      auVar30 = minps(auVar30,auVar23);
      auVar31 = maxps(auVar31,auVar23);
      local_38 = (auVar31._0_4_ - auVar30._0_4_) * 0.5;
      fStack_34 = (auVar31._4_4_ - auVar30._4_4_) * 0.5;
      fStack_30 = (auVar31._8_4_ - auVar30._8_4_) * 0.5;
      fStack_2c = (auVar31._12_4_ - auVar30._12_4_) * 0.5;
    }
  }
  else {
    local_38 = local_58 * local_38;
    fStack_34 = local_38;
    fStack_30 = local_38;
    fStack_2c = local_38;
  }
  local_128 = auVar22._0_8_;
  local_70 = uVar20;
  uVar18 = (**(code **)(local_88 + 0x88))(local_88 + 0x58,&local_128);
  pRVar9 = context->userContext;
  uVar19 = pRVar9->instStackSize - 1;
  pRVar9->instStackSize = uVar19;
  pRVar9->instID[uVar19] = 0xffffffff;
  pRVar9->instPrimID[pRVar9->instStackSize] = 0xffffffff;
  return (bool)uVar18;
}

Assistant:

bool InstanceIntersector1::pointQuery(PointQuery* query, PointQueryContext* context, const InstancePrimitive& prim)
    {
      const Instance* instance = prim.instance;

      const AffineSpace3fa local2world = instance->getLocal2World();
      const AffineSpace3fa world2local = instance->getWorld2Local();
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);
      assert((similtude && similarityScale > 0) || !similtude);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, 0, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;

        PointQueryContext context_inst(
          (Scene*)instance->object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func,
          context->userContext,
          similarityScale,
          context->userPtr);

        bool changed = instance->object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }